

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O3

void strscan_double(uint64_t x,TValue *o,int32_t ex2,int32_t neg)

{
  undefined8 local_20;
  
  if (x == 0 || -0x433 < ex2) {
    local_20 = (lua_Number)(long)x;
    if (neg != 0) {
      local_20 = -local_20;
    }
    if (ex2 == 0) goto LAB_00116997;
  }
  else {
    strscan_double_cold_1();
  }
  local_20 = ldexp(local_20,ex2);
LAB_00116997:
  o->n = local_20;
  return;
}

Assistant:

static void strscan_double(uint64_t x, TValue *o, int32_t ex2, int32_t neg)
{
  double n;

  /* Avoid double rounding for denormals. */
  if (LJ_UNLIKELY(ex2 <= -1075 && x != 0)) {
    /* NYI: all of this generates way too much code on 32 bit CPUs. */
#if (defined(__GNUC__) || defined(__clang__)) && LJ_64
    int32_t b = (int32_t)(__builtin_clzll(x)^63);
#else
    int32_t b = (x>>32) ? 32+(int32_t)lj_fls((uint32_t)(x>>32)) :
			  (int32_t)lj_fls((uint32_t)x);
#endif
    if ((int32_t)b + ex2 <= -1023 && (int32_t)b + ex2 >= -1075) {
      uint64_t rb = (uint64_t)1 << (-1075-ex2);
      if ((x & rb) && ((x & (rb+rb+rb-1)))) x += rb+rb;
      x = (x & ~(rb+rb-1));
    }
  }

  /* Convert to double using a signed int64_t conversion, then rescale. */
  lj_assertX((int64_t)x >= 0, "bad double conversion");
  n = (double)(int64_t)x;
  if (neg) n = -n;
  if (ex2) n = ldexp(n, ex2);
  o->n = n;
}